

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.h
# Opt level: O2

JointBeliefSparse * __thiscall JointBeliefSparse::Clone(JointBeliefSparse *this)

{
  JointBeliefSparse *this_00;
  
  this_00 = (JointBeliefSparse *)operator_new(0x58);
  JointBeliefSparse(this_00,this);
  return this_00;
}

Assistant:

virtual JointBeliefSparse* Clone() const
        { return new JointBeliefSparse(*this); }